

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_key.cpp
# Opt level: O2

PrivkeyHexDataStruct *
cfd::js::api::KeyStructApi::GetPrivkeyFromWif
          (PrivkeyHexDataStruct *__return_storage_ptr__,PrivkeyWifDataStruct *request)

{
  string *in_R8;
  allocator local_149;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  function<cfd::js::api::PrivkeyHexDataStruct_(const_cfd::js::api::PrivkeyWifDataStruct_&)>
  local_120;
  PrivkeyHexDataStruct local_100;
  
  PrivkeyHexDataStruct::PrivkeyHexDataStruct(__return_storage_ptr__);
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  local_130 = std::
              _Function_handler<cfd::js::api::PrivkeyHexDataStruct_(const_cfd::js::api::PrivkeyWifDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_key.cpp:99:7)>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<cfd::js::api::PrivkeyHexDataStruct_(const_cfd::js::api::PrivkeyWifDataStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_key.cpp:99:7)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_120,"GetPrivkeyFromWif",&local_149);
  ExecuteStructApi<cfd::js::api::PrivkeyWifDataStruct,cfd::js::api::PrivkeyHexDataStruct>
            (&local_100,(api *)request,(PrivkeyWifDataStruct *)&local_148,&local_120,in_R8);
  PrivkeyHexDataStruct::operator=(__return_storage_ptr__,&local_100);
  PrivkeyHexDataStruct::~PrivkeyHexDataStruct(&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::_Function_base::~_Function_base((_Function_base *)&local_148);
  return __return_storage_ptr__;
}

Assistant:

PrivkeyHexDataStruct KeyStructApi::GetPrivkeyFromWif(
    const PrivkeyWifDataStruct& request) {
  auto call_func =
      [](const PrivkeyWifDataStruct& request) -> PrivkeyHexDataStruct {
    PrivkeyHexDataStruct response;

    NetType net_type = NetType::kMainnet;
    KeyApi api;
    Privkey privkey =
        api.GetPrivkeyFromWif(request.wif, &net_type, &response.is_compressed);
    response.hex = privkey.GetHex();
    response.network = AddressStructApi::ConvertNetTypeString(net_type);
    return response;
  };

  PrivkeyHexDataStruct result;
  result = ExecuteStructApi<PrivkeyWifDataStruct, PrivkeyHexDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}